

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bigint<26> * __thiscall bigint<26>::mul<13,13>(bigint<26> *this,bigint<13> *x,bigint<13> *y)

{
  digit *__s;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  digit *pdVar5;
  uint uVar6;
  int j;
  ulong uVar7;
  ulong uVar8;
  
  if ((x->len == 0) || ((long)y->len == 0)) {
    this->len = 0;
  }
  else {
    __s = this->digits;
    uVar8 = 0;
    memset(__s,0,(long)y->len * 2);
    uVar1 = x->len;
    uVar2 = y->len;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    uVar4 = 0;
    pdVar5 = __s;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      uVar6 = 0;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        uVar6 = uVar6 + pdVar5[uVar7] + (uint)y->digits[uVar7] * (uint)x->digits[uVar8];
        pdVar5[uVar7] = (digit)uVar6;
        uVar6 = uVar6 >> 0x10;
      }
      __s[(long)(int)uVar2 + uVar8] = (digit)uVar6;
      pdVar5 = pdVar5 + 1;
    }
    this->len = uVar2 + uVar1;
    shrink(this);
  }
  return this;
}

Assistant:

bigint &mul(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(!x.len || !y.len) { len = 0; return *this; }
        memset(digits, 0, y.len*sizeof(digit));
        loopi(x.len)
        {
            dbldigit carry = 0;
            loopj(y.len)
            {
                carry += (dbldigit)x.digits[i] * (dbldigit)y.digits[j] + (dbldigit)digits[i+j];
                digits[i+j] = (digit)carry;
                carry >>= BI_DIGIT_BITS;
            }
            digits[i+y.len] = carry;
        }
        len = x.len + y.len;
        shrink();
        return *this;
    }